

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O3

void test_shutdown_send(int mode)

{
  int iVar1;
  uint uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  int32_t iVar6;
  LatencySimulator *this;
  NMQ *q;
  NMQ *q_00;
  ssize_t sVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  char buffer [2000];
  uint local_808;
  uint32_t local_804;
  
  this = (LatencySimulator *)operator_new(0x98);
  uVar9 = 1000;
  LatencySimulator::LatencySimulator(this,0x32,0x3c,0x7d,1000);
  vnet = this;
  q = nmq_new(0x11223344,(void *)0x1);
  q_00 = nmq_new(0x11223344,(void *)0x2);
  nmq_set_output_cb(q,udp_output);
  nmq_set_output_cb(q_00,udp_output);
  nmq_set_interval(q,0x32);
  nmq_set_interval(q_00,0x32);
  nmq_set_dup_acks_limit(q,'\x02');
  nmq_set_dup_acks_limit(q_00,'\x02');
  nmq_start(q);
  nmq_start(q_00);
  iclock();
  uVar3 = iclock();
  uVar8 = 0;
  uVar11 = 0;
  uVar10 = 0;
LAB_00103099:
  if (g_done == 0) {
    usleep(1000);
    uVar4 = iclock();
    uVar5 = iclock();
    nmq_update(q,uVar5);
    uVar5 = iclock();
    nmq_update(q_00,uVar5);
    iVar1 = g_done;
    if (g_done == 0 && uVar8 < 10) {
      do {
        local_808 = uVar10;
        local_804 = uVar4;
        iVar6 = nmq_send(q,(char *)&local_808,8);
        uVar10 = (0 < iVar6) + uVar10;
        if (uVar8 == 9) {
          nmq_shutdown_send(q);
          uVar8 = 10;
          iVar1 = g_done;
          goto joined_r0x0010314a;
        }
        uVar8 = uVar8 + 1;
      } while (g_done == 0);
      iVar1 = 1;
    }
joined_r0x0010314a:
    do {
      if (iVar1 != 0) goto LAB_00103186;
      sVar7 = LatencySimulator::recv(vnet,2,&local_808,2000,(int)uVar9);
      if ((int)sVar7 < 0) goto LAB_001031a0;
      nmq_input(q_00,(char *)&local_808,(int)sVar7);
      iVar1 = g_done;
    } while( true );
  }
  goto LAB_001032a0;
LAB_001031a0:
  if (g_done != 0) goto LAB_00103186;
  sVar7 = LatencySimulator::recv(vnet,1,&local_808,2000,(int)uVar9);
  if ((int)sVar7 < 0) goto LAB_001031e2;
  nmq_input(q,(char *)&local_808,(int)sVar7);
  goto LAB_001031a0;
LAB_001031e2:
  if (g_done != 0) goto LAB_00103186;
  iVar6 = nmq_recv(q_00,(char *)&local_808,2000);
  if (iVar6 < 1) {
    if (g_done == 0) goto LAB_0010320c;
    goto LAB_00103186;
  }
  nmq_send(q_00,(char *)&local_808,iVar6);
  goto LAB_001031e2;
  while( true ) {
    fprintf(_stderr,"peer: %d, outer receive sn: %u, ts: %u\n",1);
    if (uVar11 != uVar2) {
      fprintf(_stderr,"ERROR sn %d<->%d\n");
      return;
    }
    uVar9 = (ulong)(uVar4 - uVar5);
    uVar11 = uVar11 + 1;
    fprintf(_stderr,"[RECV] mode=%d sn=%d rtt=%d\n",(ulong)(uint)mode);
    if (g_done != 0) break;
LAB_0010320c:
    iVar6 = nmq_recv(q,(char *)&local_808,2000);
    uVar5 = local_804;
    uVar2 = local_808;
    if (iVar6 < 1) break;
  }
LAB_00103186:
  if (999 < uVar11) {
LAB_001032a0:
    uVar4 = iclock();
    nmq_destroy(q);
    nmq_destroy(q_00);
    printf("%s mode result (%dms):\n",(&PTR_anon_var_dwarf_4e96_00106d40)[mode],
           (ulong)(uVar4 - uVar3));
    return;
  }
  goto LAB_00103099;
}

Assistant:

void test_shutdown_send(int mode)
{
    // 创建模拟网络：丢包率10%，Rtt 60ms~125ms
    vnet = new LatencySimulator(50, 60, 125);

    // 创建两个端点的 kcp对象，第一个参数 conv是会话编号，同一个会话需要相同
    // 最后一个是 user参数，用来传递标识
//	NMQ *kcp1 = ikcp_create(0x11223344, (void*)0);
//	NMQ *kcp2 = ikcp_create(0x11223344, (void*)1);
    NMQ *kcp1 = nmq_new(0x11223344, (void*)1);
    NMQ *kcp2 = nmq_new(0x11223344, (void*)2);

    // 设置kcp的下层输出，这里为 udp_output，模拟udp网络输出函数
    nmq_set_output_cb(kcp1, udp_output);
    nmq_set_output_cb(kcp2, udp_output);
    nmq_set_interval(kcp1, 50);
    nmq_set_interval(kcp2, 50);
    nmq_set_dup_acks_limit(kcp1, 2);
    nmq_set_dup_acks_limit(kcp2, 2);
    nmq_start(kcp1);
    nmq_start(kcp2);

    uint32_t current = iclock();
    uint32_t slap = current + 20;
//	uint32_t slap = current;
    uint32_t index = 0;
    uint32_t next = 0;
    int64_t sumrtt = 0;
    int count = 0;
    int maxrtt = 0;

    char buffer[2000];
    int hr;
    uint32_t cnt = 0;

    uint32_t ts1 = iclock();

    while (!g_done) {
        isleep(1);
        current = iclock();
        nmq_update(kcp1, iclock());

        nmq_update(kcp2, iclock());

        while (cnt < 10 && !g_done) {
            ((uint32_t*)buffer)[0] = index;
            ((uint32_t*)buffer)[1] = current;

            // 发送上层协议包
            if (nmq_send(kcp1, buffer, 8) > 0) {
                index++;
            }
            cnt++;
            if (cnt == 10) {
                nmq_shutdown_send(kcp1);
            }
        }

        // 处理虚拟网络：检测是否有udp包从p1->p2
        while (!g_done) {
            hr = vnet->recv(2, buffer, 2000);
//            fprintf(stderr, "peer 2. read buf to peer 2. nmq_input, hr: %d\n", hr);
            if (hr < 0) break;
            // 如果 p2收到udp，则作为下层协议输入到kcp2
            nmq_input(kcp2, buffer, hr);
        }

        // 处理虚拟网络：检测是否有udp包从p2->p1
        while (!g_done) {
            hr = vnet->recv(1, buffer, 2000);
//            fprintf(stderr, "peer 1. read buf to peer 1. nmq_input, hr: %d\n", hr);
            if (hr < 0) break;
            // 如果 p1收到udp，则作为下层协议输入到kcp1
            int32_t ret =  nmq_input(kcp1, buffer, hr);
        }

        // kcp2接收到任何包都返回回去
        while (!g_done) {
            hr = nmq_recv(kcp2, buffer, 2000);
            // 没有收到包就退出
            if (hr <= 0) {
                break;
            }
            // 如果收到包就回射
            nmq_send(kcp2, buffer, hr);     // if error occurs, then data will be lost.
        }

        // kcp1收到kcp2的回射数据
        while (!g_done) {
            hr = nmq_recv(kcp1, buffer, 2000);
//            fprintf(stderr, "peer 1. nmq_recv, hr: %d\n", hr);
            // 没有收到包就退出
            if (hr <= 0) break;
            uint32_t sn = *(uint32_t*)(buffer + 0);
            uint32_t ts = *(uint32_t*)(buffer + 4);
            uint32_t rtt = current - ts;

            fprintf(stderr, "peer: %d, outer receive sn: %u, ts: %u\n", 1, sn, ts);

            if (sn != next) {
                // 如果收到的包不连续
                fprintf(stderr, "ERROR sn %d<->%d\n", (int)sn, (int)next);
                return;
            }

            next++;
            sumrtt += rtt;
            count++;
            if (rtt > (uint32_t)maxrtt) maxrtt = rtt;

            fprintf(stderr, "[RECV] mode=%d sn=%d rtt=%d\n", mode, (int)sn, (int)rtt);
        }
        if (next >= MAX_SN) break;
    }

    ts1 = iclock() - ts1;

    nmq_destroy(kcp1);
    nmq_destroy(kcp2);

    const char *names[3] = { "default", "normal", "fast" };
    printf("%s mode result (%dms):\n", names[mode], (int)ts1);
}